

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_lex.c
# Opt level: O1

void yy_flush_buffer(YY_BUFFER_STATE b,yyscan_t yyscanner)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  YY_BUFFER_STATE pyVar4;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    pyVar4 = (YY_BUFFER_STATE)0x0;
    b->yy_n_chars = 0;
    *b->yy_ch_buf = '\0';
    b->yy_ch_buf[1] = '\0';
    b->yy_buf_pos = b->yy_ch_buf;
    b->yy_at_bol = 1;
    b->yy_buffer_status = 0;
    lVar1 = *(long *)((long)yyscanner + 0x28);
    if (lVar1 != 0) {
      pyVar4 = *(YY_BUFFER_STATE *)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8);
    }
    if (pyVar4 == b) {
      lVar2 = *(long *)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8);
      *(undefined4 *)((long)yyscanner + 0x34) = *(undefined4 *)(lVar2 + 0x1c);
      puVar3 = *(undefined1 **)(lVar2 + 0x10);
      *(undefined1 **)((long)yyscanner + 0x40) = puVar3;
      *(undefined1 **)((long)yyscanner + 0x80) = puVar3;
      *(undefined8 *)((long)yyscanner + 8) =
           **(undefined8 **)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8);
      *(undefined1 *)((long)yyscanner + 0x30) = *puVar3;
      return;
    }
  }
  return;
}

Assistant:

void yy_flush_buffer (YY_BUFFER_STATE  b , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if ( ! b )
		return;

	b->yy_n_chars = 0;

	/* We always need two end-of-buffer characters.  The first causes
	 * a transition to the end-of-buffer state.  The second causes
	 * a jam in that state.
	 */
	b->yy_ch_buf[0] = YY_END_OF_BUFFER_CHAR;
	b->yy_ch_buf[1] = YY_END_OF_BUFFER_CHAR;

	b->yy_buf_pos = &b->yy_ch_buf[0];

	b->yy_at_bol = 1;
	b->yy_buffer_status = YY_BUFFER_NEW;

	if ( b == YY_CURRENT_BUFFER )
		yy_load_buffer_state( yyscanner );
}